

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_vector.cpp
# Opt level: O2

string * __thiscall
duckdb::SelectionVector::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SelectionVector *this,idx_t count)

{
  idx_t iVar1;
  idx_t __val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::to_string(&local_50,count);
  ::std::operator+(&local_70,"Selection Vector (",&local_50);
  ::std::operator+(__return_storage_ptr__,&local_70,") [");
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  for (iVar1 = 0; count != iVar1; iVar1 = iVar1 + 1) {
    if (iVar1 != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    __val = iVar1;
    if (this->sel_vector != (sel_t *)0x0) {
      __val = (idx_t)this->sel_vector[iVar1];
    }
    ::std::__cxx11::to_string(&local_70,__val);
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string SelectionVector::ToString(idx_t count) const {
	string result = "Selection Vector (" + to_string(count) + ") [";
	for (idx_t i = 0; i < count; i++) {
		if (i != 0) {
			result += ", ";
		}
		result += to_string(get_index(i));
	}
	result += "]";
	return result;
}